

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O3

size_t ZSTD_execSequenceLast7
                 (BYTE *op,BYTE *oend,seq_t sequence,BYTE **litPtr,BYTE *litLimit,BYTE *base,
                 BYTE *vBase,BYTE *dictEnd)

{
  size_t sVar1;
  BYTE *pBVar2;
  BYTE *__dest;
  BYTE BVar3;
  BYTE *pBVar4;
  long lVar5;
  
  sVar1 = sequence.matchLength + sequence.litLength;
  pBVar2 = op + sVar1;
  if (oend < pBVar2) {
    return 0xffffffffffffffba;
  }
  if (litLimit < *litPtr + sequence.litLength) {
    return 0xffffffffffffffec;
  }
  __dest = op + sequence.litLength;
  if (0 < (long)sequence.litLength) {
    do {
      pBVar4 = *litPtr;
      *litPtr = pBVar4 + 1;
      *op = *pBVar4;
      op = op + 1;
    } while (op < __dest);
  }
  pBVar4 = __dest + -sequence.offset;
  if ((ulong)((long)__dest - (long)base) < sequence.offset) {
    if ((ulong)((long)__dest - (long)vBase) < sequence.offset) {
      return 0xffffffffffffffec;
    }
    lVar5 = (long)pBVar4 - (long)base;
    pBVar4 = dictEnd + lVar5;
    if (pBVar4 + sequence.matchLength <= dictEnd) {
      memmove(__dest,pBVar4,sequence.matchLength);
      return sVar1;
    }
    memmove(__dest,pBVar4,-lVar5);
    op = __dest + -lVar5;
    pBVar4 = base;
  }
  for (; op < pBVar2; op = op + 1) {
    BVar3 = *pBVar4;
    pBVar4 = pBVar4 + 1;
    *op = BVar3;
  }
  return sVar1;
}

Assistant:

FORCE_NOINLINE
size_t ZSTD_execSequenceLast7(BYTE* op,
                              BYTE* const oend, seq_t sequence,
                              const BYTE** litPtr, const BYTE* const litLimit,
                              const BYTE* const base, const BYTE* const vBase, const BYTE* const dictEnd)
{
    BYTE* const oLitEnd = op + sequence.litLength;
    size_t const sequenceLength = sequence.litLength + sequence.matchLength;
    BYTE* const oMatchEnd = op + sequenceLength;   /* risk : address space overflow (32-bits) */
    const BYTE* const iLitEnd = *litPtr + sequence.litLength;
    const BYTE* match = oLitEnd - sequence.offset;

    /* check */
    if (oMatchEnd>oend) return ERROR(dstSize_tooSmall);   /* last match must fit within dstBuffer */
    if (iLitEnd > litLimit) return ERROR(corruption_detected);   /* try to read beyond literal buffer */

    /* copy literals */
    while (op < oLitEnd) *op++ = *(*litPtr)++;

    /* copy Match */
    if (sequence.offset > (size_t)(oLitEnd - base)) {
        /* offset beyond prefix */
        if (sequence.offset > (size_t)(oLitEnd - vBase)) return ERROR(corruption_detected);
        match = dictEnd - (base-match);
        if (match + sequence.matchLength <= dictEnd) {
            memmove(oLitEnd, match, sequence.matchLength);
            return sequenceLength;
        }
        /* span extDict & currentPrefixSegment */
        {   size_t const length1 = dictEnd - match;
            memmove(oLitEnd, match, length1);
            op = oLitEnd + length1;
            sequence.matchLength -= length1;
            match = base;
    }   }
    while (op < oMatchEnd) *op++ = *match++;
    return sequenceLength;
}